

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O0

char * ngram_search_bp_hyp(ngram_search_t *ngs,int bpidx)

{
  int32 iVar1;
  bptbl_t *pbVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  size_t len_1;
  bptbl_t *be_1;
  bptbl_t *be;
  size_t sStack_38;
  int bp;
  size_t len;
  char *c;
  ps_search_t *base;
  int bpidx_local;
  ngram_search_t *ngs_local;
  
  if (bpidx == -1) {
    ngs_local = (ngram_search_t *)0x0;
  }
  else {
    sStack_38 = 0;
    iVar1 = bpidx;
    while (be._4_4_ = iVar1, be._4_4_ != -1) {
      pbVar2 = ngs->bp_table;
      iVar1 = pbVar2[be._4_4_].bp;
      iVar3 = dict_real_word((ngs->base).dict,pbVar2[be._4_4_].wid);
      if (iVar3 != 0) {
        sVar4 = strlen(((ngs->base).dict)->word
                       [((ngs->base).dict)->word[pbVar2[be._4_4_].wid].basewid].word);
        sStack_38 = sVar4 + 1 + sStack_38;
      }
    }
    ckd_free((ngs->base).hyp_str);
    if (sStack_38 == 0) {
      (ngs->base).hyp_str = (char *)0x0;
      ngs_local = (ngram_search_t *)(ngs->base).hyp_str;
    }
    else {
      pcVar5 = (char *)__ckd_calloc__(1,sStack_38,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                      ,0x239);
      (ngs->base).hyp_str = pcVar5;
      len = (size_t)((ngs->base).hyp_str + (sStack_38 - 1));
      iVar1 = bpidx;
      while (be._4_4_ = iVar1, be._4_4_ != -1) {
        pbVar2 = ngs->bp_table;
        iVar1 = pbVar2[be._4_4_].bp;
        iVar3 = dict_real_word((ngs->base).dict,pbVar2[be._4_4_].wid);
        if (iVar3 != 0) {
          sVar4 = strlen(((ngs->base).dict)->word
                         [((ngs->base).dict)->word[pbVar2[be._4_4_].wid].basewid].word);
          len = len - sVar4;
          memcpy((void *)len,
                 ((ngs->base).dict)->word[((ngs->base).dict)->word[pbVar2[be._4_4_].wid].basewid].
                 word,sVar4);
          if ((ngs->base).hyp_str < len) {
            len = len + -1;
            *(char *)len = ' ';
          }
        }
      }
      ngs_local = (ngram_search_t *)(ngs->base).hyp_str;
    }
  }
  return (char *)ngs_local;
}

Assistant:

char const *
ngram_search_bp_hyp(ngram_search_t *ngs, int bpidx)
{
    ps_search_t *base = ps_search_base(ngs);
    char *c;
    size_t len;
    int bp;

    if (bpidx == NO_BP)
        return NULL;

    bp = bpidx;
    len = 0;
    while (bp != NO_BP) {
        bptbl_t *be = &ngs->bp_table[bp];
        bp = be->bp;
        if (dict_real_word(ps_search_dict(ngs), be->wid))
            len += strlen(dict_basestr(ps_search_dict(ngs), be->wid)) + 1;
    }

    ckd_free(base->hyp_str);
    if (len == 0) {
	base->hyp_str = NULL;
	return base->hyp_str;
    }
    base->hyp_str = ckd_calloc(1, len);

    bp = bpidx;
    c = base->hyp_str + len - 1;
    while (bp != NO_BP) {
        bptbl_t *be = &ngs->bp_table[bp];
        size_t len;

        bp = be->bp;
        if (dict_real_word(ps_search_dict(ngs), be->wid)) {
            len = strlen(dict_basestr(ps_search_dict(ngs), be->wid));
            c -= len;
            memcpy(c, dict_basestr(ps_search_dict(ngs), be->wid), len);
            if (c > base->hyp_str) {
                --c;
                *c = ' ';
            }
        }
    }

    return base->hyp_str;
}